

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void btConvexHullInternal::DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
               (Int128 a,Int128 b,Int128 *resLow,Int128 *resHigh)

{
  Int128 value;
  Int128 value_00;
  Int128 value_01;
  Int128 value_02;
  bool bVar1;
  Int128 *this;
  uint64_t uVar2;
  uint64_t in_RCX;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *in_RDX;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t in_RSI;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *in_RDI;
  uint64_t *in_R8;
  uint64_t *in_R9;
  Int128 value_03;
  Int128 value_04;
  Int128 value_05;
  Int128 value_06;
  Int128 value_07;
  Int128 value_08;
  Int128 value_09;
  Int128 p0110;
  Int128 p11;
  Int128 p10;
  Int128 p01;
  Int128 p00;
  Int128 *in_stack_fffffffffffffe38;
  Int128 local_190;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_180;
  uint64_t local_178;
  Int128 local_170;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_160;
  uint64_t local_158;
  Int128 local_150;
  uint64_t local_140;
  uint64_t local_138;
  Int128 local_130;
  uint64_t local_120;
  uint64_t local_118;
  Int128 local_110;
  Int128 local_100;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_f0;
  uint64_t local_e8;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_e0;
  uint64_t local_d8;
  Int128 local_d0;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_c0;
  uint64_t local_b8;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_b0;
  uint64_t local_a8;
  Int128 local_a0;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_90;
  uint64_t local_88;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_80;
  uint64_t local_78;
  Int128 local_70;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_60;
  uint64_t local_58;
  Int128 local_40;
  uint64_t *local_30;
  uint64_t *local_28;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_20;
  uint64_t local_18;
  DMul<btConvexHullInternal::Int128,_unsigned_long> *local_10;
  uint64_t local_8;
  uint64_t extraout_RDX_00;
  
  value_02.high = in_RSI;
  value_02.low = (uint64_t)in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RCX;
  local_10 = in_RDI;
  local_8 = in_RSI;
  this = (Int128 *)low(value_02);
  local_60 = local_20;
  local_58 = local_18;
  value_01.high = local_18;
  value_01.low = (uint64_t)local_20;
  low(value_01);
  local_40 = mul((uint64_t)this,(uint64_t)in_stack_fffffffffffffe38);
  local_80 = local_10;
  local_78 = local_8;
  value_00.high = local_8;
  value_00.low = (uint64_t)local_10;
  low(value_00);
  local_90 = local_20;
  local_88 = local_18;
  value_03.high = extraout_RDX;
  value_03.low = local_18;
  high(local_20,value_03);
  local_70 = mul((uint64_t)this,(uint64_t)in_stack_fffffffffffffe38);
  value_04.high = local_70.high;
  local_b0 = local_10;
  local_a8 = local_8;
  value_04.low = local_8;
  high(local_10,value_04);
  local_c0 = local_20;
  local_b8 = local_18;
  value.high = local_18;
  value.low = (uint64_t)local_20;
  low(value);
  local_a0 = mul((uint64_t)this,(uint64_t)in_stack_fffffffffffffe38);
  value_05.high = local_a0.high;
  local_e0 = local_10;
  local_d8 = local_8;
  value_05.low = local_8;
  high(local_10,value_05);
  local_f0 = local_20;
  local_e8 = local_18;
  value_06.high = extraout_RDX_00;
  value_06.low = local_18;
  high(local_20,value_06);
  local_d0 = mul((uint64_t)this,(uint64_t)in_stack_fffffffffffffe38);
  local_120 = local_70.low;
  local_118 = local_70.high;
  uVar2 = low(local_70);
  Int128::Int128(&local_110,uVar2);
  local_140 = local_a0.low;
  local_138 = local_a0.high;
  uVar2 = low(local_a0);
  Int128::Int128(&local_130,uVar2);
  local_100 = Int128::operator+(this,in_stack_fffffffffffffe38);
  value_07.high = local_100.high;
  local_160 = (DMul<btConvexHullInternal::Int128,_unsigned_long> *)local_70.low;
  local_158 = local_70.high;
  value_07.low = local_70.high;
  uVar2 = high((DMul<btConvexHullInternal::Int128,_unsigned_long> *)local_70.low,value_07);
  Int128::Int128(&local_150,uVar2);
  Int128::operator+=(&local_d0,&local_150);
  local_180 = (DMul<btConvexHullInternal::Int128,_unsigned_long> *)local_a0.low;
  local_178 = local_a0.high;
  value_08.high = extraout_RDX_01;
  value_08.low = local_a0.high;
  uVar2 = high((DMul<btConvexHullInternal::Int128,_unsigned_long> *)local_a0.low,value_08);
  Int128::Int128(&local_170,uVar2);
  Int128::operator+=(&local_d0,&local_170);
  value_09.high = extraout_RDX_02;
  value_09.low = local_100.high;
  uVar2 = high((DMul<btConvexHullInternal::Int128,_unsigned_long> *)local_100.low,value_09);
  Int128::Int128(&local_190,uVar2);
  Int128::operator+=(&local_d0,&local_190);
  shlHalf(&local_100);
  Int128::operator+=(&local_40,&local_100);
  bVar1 = Int128::operator<(&local_40,&local_100);
  if (bVar1) {
    Int128::operator++(&local_d0);
  }
  *local_28 = local_40.low;
  local_28[1] = local_40.high;
  *local_30 = local_d0.low;
  local_30[1] = local_d0.high;
  return;
}

Assistant:

static void mul(UWord a, UWord b, UWord& resLow, UWord& resHigh)
				{
					UWord p00 = mul(low(a), low(b));
					UWord p01 = mul(low(a), high(b));
					UWord p10 = mul(high(a), low(b));
					UWord p11 = mul(high(a), high(b));
					UWord p0110 = UWord(low(p01)) + UWord(low(p10));
					p11 += high(p01);
					p11 += high(p10);
					p11 += high(p0110);
					shlHalf(p0110);
					p00 += p0110;
					if (p00 < p0110)
					{
						++p11;
					}
					resLow = p00;
					resHigh = p11;
				}